

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arxmlStorage.cpp
# Opt level: O0

ShortnameElement * __thiscall
lsp::ArxmlStorage::getLastShortnameByOffset(ArxmlStorage *this,uint32_t *offset,uint32_t fileIndex)

{
  ordered_index_impl<boost::multi_index::composite_key<lsp::ShortnameElement,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::fileIndex>,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::charOffset>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>,std::less<boost::multi_index::composite_key_result<boost::multi_index::composite_key<lsp::ShortnameElement,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::fileIndex>,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::charOffset>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>>,boost::multi_index::deta___>_0>_boost__multi_index__detail__ordered_unique_tag_boost__multi_index__detail__null_augment_policy>
  *this_00;
  bool bVar1;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>_>
  *this_01;
  value_type *pvVar2;
  elementNotFoundException *peVar3;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>_>
  local_40;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>_>
  local_38;
  tuple<unsigned_int,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  local_30;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>_>
  local_28;
  iterator res;
  uint32_t fileIndex_local;
  uint32_t *offset_local;
  ArxmlStorage *this_local;
  
  this_00 = (ordered_index_impl<boost::multi_index::composite_key<lsp::ShortnameElement,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::fileIndex>,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::charOffset>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>,std::less<boost::multi_index::composite_key_result<boost::multi_index::composite_key<lsp::ShortnameElement,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::fileIndex>,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::charOffset>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>>,boost::multi_index::deta___>_0>_boost__multi_index__detail__ordered_unique_tag_boost__multi_index__detail__null_augment_policy>
             *)this->shortnamesOffsetIndex_;
  res.node._4_4_ = fileIndex;
  boost::tuples::make_tuple<unsigned_int,unsigned_int>
            ((tuples *)&local_30,(uint *)((long)&res.node + 4),offset);
  local_28.node =
       (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>
        *)boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::composite_key<lsp::ShortnameElement,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::fileIndex>,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::charOffset>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>,std::less<boost::multi_index::composite_key_result<boost::multi_index::composite_key<lsp::ShortnameElement,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::fileIndex>,boost::multi_index::member<lsp::ShortnameElement,unsigned_int,&lsp::ShortnameElement::charOffset>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>>,boost::multi_index::deta...>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::
          upper_bound<boost::tuples::tuple<unsigned_int,unsigned_int,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                    (this_00,&local_30);
  local_38.node =
       (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>
        *)boost::multi_index::detail::ordered_index_impl<$c87b5e5d$>::begin
                    (&this->shortnamesOffsetIndex_->super_type);
  bVar1 = boost::multi_index::detail::operator==(&local_28,&local_38);
  if (bVar1) {
    peVar3 = (elementNotFoundException *)__cxa_allocate_exception(8);
    memset(peVar3,0,8);
    elementNotFoundException::elementNotFoundException(peVar3);
    __cxa_throw(peVar3,&elementNotFoundException::typeinfo,
                elementNotFoundException::~elementNotFoundException);
  }
  do {
    this_01 = boost::multi_index::detail::
              bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>_>
              ::operator--(&local_28);
    pvVar2 = boost::multi_index::detail::
             bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>_>
             ::operator*(this_01);
    if (pvVar2->fileIndex == res.node._4_4_) {
      pvVar2 = boost::multi_index::detail::
               bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>_>
               ::operator*(&local_28);
      return pvVar2;
    }
    local_40.node =
         (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>
          *)boost::multi_index::detail::ordered_index_impl<$c87b5e5d$>::begin
                      (&this->shortnamesOffsetIndex_->super_type);
    bVar1 = boost::multi_index::detail::operator==(&local_28,&local_40);
  } while (!bVar1);
  peVar3 = (elementNotFoundException *)__cxa_allocate_exception(8);
  memset(peVar3,0,8);
  elementNotFoundException::elementNotFoundException(peVar3);
  __cxa_throw(peVar3,&elementNotFoundException::typeinfo,
              elementNotFoundException::~elementNotFoundException);
}

Assistant:

const lsp::ShortnameElement &lsp::ArxmlStorage::getLastShortnameByOffset(const uint32_t &offset, const uint32_t fileIndex) const
{
    //Get the element with that has a higher offset that we look for
    auto res = shortnamesOffsetIndex_.upper_bound(boost::make_tuple(fileIndex, offset));
    //First element is already higher than we look for -> not found
    if(res == shortnamesOffsetIndex_.begin())
    {
        throw lsp::elementNotFoundException();
    }
    //Now we can look for the first previous element that matches the fileindex
    while((*(--res)).fileIndex != fileIndex)
    {
        if(res == shortnamesOffsetIndex_.begin())
            throw lsp::elementNotFoundException();
    }
    return *res;
}